

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O3

int Gia_ManTerRetire2(Gia_ManTer_t *p,uint *pState)

{
  uint uVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  uint *puVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  
  pGVar7 = p->pAig;
  iVar6 = pGVar7->nRegs;
  if (0 < (long)iVar6) {
    iVar8 = -1;
    bVar9 = 0;
    uVar10 = 0;
    do {
      if (((~(pState[uVar10 >> 4 & 0xfffffff] >> (bVar9 & 0x1e)) & 3) != 0) &&
         (p->pRetired[uVar10] == '\0')) {
        if (iVar8 <= p->pCountX[uVar10]) {
          iVar8 = p->pCountX[uVar10];
        }
      }
      uVar10 = uVar10 + 1;
      bVar9 = bVar9 + 2;
    } while ((long)iVar6 != uVar10);
    if (-1 < iVar8) {
      if (0 < iVar6) {
        bVar9 = 0;
        uVar10 = 0;
        do {
          if ((((~(pState[uVar10 >> 4 & 0xfffffff] >> (bVar9 & 0x1e)) & 3) != 0) &&
              (p->pRetired[uVar10] == '\0')) && (iVar8 == p->pCountX[uVar10])) {
            p->pRetired[uVar10] = '\x01';
            Vec_IntPush(p->vRetired,(int)uVar10);
            if (iVar8 == 0) break;
            pGVar7 = p->pAig;
          }
          uVar10 = uVar10 + 1;
          bVar9 = bVar9 + 2;
        } while ((long)uVar10 < (long)pGVar7->nRegs);
      }
      pVVar2 = p->vRetired;
      iVar6 = pVVar2->nSize;
      if (0 < iVar6) {
        piVar3 = pVVar2->pArray;
        pGVar7 = p->pAig;
        puVar4 = p->pDataSimCis;
        pVVar5 = pGVar7->vCis;
        lVar11 = 0;
        do {
          iVar8 = (pVVar5->nSize - pGVar7->nRegs) + piVar3[lVar11];
          iVar6 = iVar8 >> 4;
          uVar1 = puVar4[iVar6];
          bVar9 = (char)iVar8 * '\x02';
          puVar4[iVar6] = (~(uVar1 >> (bVar9 & 0x1f)) & 3) << (bVar9 & 0x1f) ^ uVar1;
          lVar11 = lVar11 + 1;
          iVar6 = pVVar2->nSize;
        } while (lVar11 < iVar6);
      }
      return iVar6;
    }
  }
  __assert_fail("iMaxTerValue >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTsim.c"
                ,0x1a6,"int Gia_ManTerRetire2(Gia_ManTer_t *, unsigned int *)");
}

Assistant:

int Gia_ManTerRetire2( Gia_ManTer_t * p, unsigned * pState )
{
    int i, Entry, iMaxTerValue = -1;
    // find non-retired register with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue < p->pCountX[i] )
            iMaxTerValue = p->pCountX[i];
    assert( iMaxTerValue >= 0 );
    // retire the first registers with this value
    for ( i = 0; i < Gia_ManRegNum(p->pAig); i++ )
        if ( Gia_ManTerSimInfoGet( pState, i ) != GIA_UND && !p->pRetired[i] && iMaxTerValue == p->pCountX[i] )
        {
            assert( p->pRetired[i] == 0 );
            p->pRetired[i] = 1;
            Vec_IntPush( p->vRetired, i );
            if ( iMaxTerValue == 0 )
                break;
        }
    // update all the retired registers
    Vec_IntForEachEntry( p->vRetired, Entry, i )
        Gia_ManTerSimInfoSet( p->pDataSimCis, Gia_ManPiNum(p->pAig)+Entry, GIA_UND );
    return Vec_IntSize(p->vRetired);
}